

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

void __thiscall
FreeTypeFaceWrapper::SetupFormatSpecificExtender
          (FreeTypeFaceWrapper *this,string *inFontFilePath,string *inPFMFilePath)

{
  int iVar1;
  char *__s1;
  FreeTypeType1Wrapper *this_00;
  FreeTypeOpenTypeWrapper *this_01;
  Trace *this_02;
  char *fontFormat;
  string *inPFMFilePath_local;
  string *inFontFilePath_local;
  FreeTypeFaceWrapper *this_local;
  
  if (this->mFace == (FT_Face)0x0) {
    this->mFormatParticularWrapper = (IFreeTypeFaceExtender *)0x0;
  }
  else {
    __s1 = FT_Get_X11_Font_Format(this->mFace);
    iVar1 = strcmp(__s1,scType1);
    if (iVar1 == 0) {
      this_00 = (FreeTypeType1Wrapper *)operator_new(0x2558);
      FreeTypeType1Wrapper::FreeTypeType1Wrapper(this_00,this->mFace,inFontFilePath,inPFMFilePath);
      this->mFormatParticularWrapper = (IFreeTypeFaceExtender *)this_00;
    }
    else {
      iVar1 = strcmp(__s1,scCFF);
      if ((iVar1 == 0) || (iVar1 = strcmp(__s1,scTrueType), iVar1 == 0)) {
        this_01 = (FreeTypeOpenTypeWrapper *)operator_new(0x28);
        FreeTypeOpenTypeWrapper::FreeTypeOpenTypeWrapper(this_01,this->mFace);
        this->mFormatParticularWrapper = (IFreeTypeFaceExtender *)this_01;
      }
      else {
        this->mFormatParticularWrapper = (IFreeTypeFaceExtender *)0x0;
        this_02 = Trace::DefaultTrace();
        Trace::TraceToLog(this_02,
                          "Failure in FreeTypeFaceWrapper::SetupFormatSpecificExtender, could not find format specific implementation for %s"
                          ,__s1);
      }
    }
  }
  return;
}

Assistant:

void FreeTypeFaceWrapper::SetupFormatSpecificExtender(const std::string& inFontFilePath,const std::string& inPFMFilePath /*pass empty if non existant or irrelevant*/)
{
	if(mFace)
	{
		const char* fontFormat = FT_Get_X11_Font_Format(mFace);

		if(strcmp(fontFormat,scType1) == 0)
			mFormatParticularWrapper = new FreeTypeType1Wrapper(mFace,inFontFilePath,inPFMFilePath);
		else if(strcmp(fontFormat,scCFF) == 0 || strcmp(fontFormat,scTrueType) == 0)
			mFormatParticularWrapper = new FreeTypeOpenTypeWrapper(mFace);
		else
		{
			mFormatParticularWrapper = NULL;
			TRACE_LOG1("Failure in FreeTypeFaceWrapper::SetupFormatSpecificExtender, could not find format specific implementation for %s",fontFormat);
		}
	}
	else
		mFormatParticularWrapper = NULL;
		
}